

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_compare_distr(Integer g_a,Integer g_b)

{
  C_Integer *pCVar1;
  long *plVar2;
  int *piVar3;
  long *plVar4;
  C_Integer *pCVar5;
  int *piVar6;
  ushort uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ushort uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int handle;
  int handle_00;
  char err_string [256];
  
  handle_00 = (int)g_a + 1000;
  handle = (int)g_b + 1000;
  uVar10 = calc_maplen(handle_00);
  uVar11 = calc_maplen(handle);
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","distribution a");
    pnga_error(err_string,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","distribution a");
    pnga_error(err_string,g_a);
  }
  if ((g_b < -1000) || ((long)_max_global_array <= g_b + 1000)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","distribution b");
    pnga_error(err_string,g_b);
  }
  if (GA[g_b + 1000].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","distribution b");
    pnga_error(err_string,g_b);
  }
  uVar7 = GA[handle_00].ndim;
  if (uVar7 != GA[handle].ndim) {
    return 0;
  }
  uVar13 = 0;
  if (0 < (short)uVar7) {
    uVar13 = uVar7;
  }
  uVar14 = (ulong)uVar13;
  uVar15 = 0;
  while (uVar14 != uVar15) {
    pCVar5 = GA[handle_00].dims + uVar15;
    pCVar1 = GA[handle].dims + uVar15;
    uVar15 = uVar15 + 1;
    if (*pCVar5 != *pCVar1) {
      return 0;
    }
  }
  uVar8 = GA[handle_00].distr_type;
  if (uVar8 == GA[handle].distr_type) {
    if (uVar8 - 1 < 3) {
      uVar15 = 0;
      while (uVar14 != uVar15) {
        pCVar5 = GA[handle_00].block_dims + uVar15;
        pCVar1 = GA[handle].block_dims + uVar15;
        uVar15 = uVar15 + 1;
        if (*pCVar5 != *pCVar1) {
          return 0;
        }
      }
      uVar15 = 0;
      while (uVar14 != uVar15) {
        pCVar5 = GA[handle_00].num_blocks + uVar15;
        pCVar1 = GA[handle].num_blocks + uVar15;
        uVar15 = uVar15 + 1;
        if (*pCVar5 != *pCVar1) {
          return 0;
        }
      }
      if ((uVar8 & 0xfffffffe) == 2) {
        uVar15 = 0;
        while (uVar14 != uVar15) {
          piVar6 = GA[handle_00].nblock + uVar15;
          piVar3 = GA[handle].nblock + uVar15;
          uVar15 = uVar15 + 1;
          if (*piVar6 != *piVar3) {
            return 0;
          }
        }
      }
    }
    else if (uVar8 == 4) {
      if (uVar10 != uVar11) {
        return 0;
      }
      uVar15 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar15 = 0;
      }
      uVar16 = 0;
      do {
        if (uVar15 == uVar16) break;
        plVar2 = GA[handle_00].mapc + uVar16;
        if (*plVar2 != GA[handle].mapc[uVar16]) {
          return 0;
        }
        uVar16 = uVar16 + 1;
      } while (*plVar2 != -1);
      uVar15 = 0;
      while (uVar14 != uVar15) {
        piVar6 = GA[handle_00].nblock + uVar15;
        piVar3 = GA[handle].nblock + uVar15;
        uVar15 = uVar15 + 1;
        if (*piVar6 != *piVar3) {
          return 0;
        }
      }
    }
    else if (uVar8 == 0) {
      if (uVar10 != uVar11) {
        return 0;
      }
      uVar15 = (ulong)uVar10;
      if ((int)uVar10 < 1) {
        uVar15 = 0;
      }
      uVar14 = 0;
      do {
        if (uVar15 == uVar14) break;
        plVar2 = GA[handle_00].mapc + uVar14;
        if (*plVar2 != GA[handle].mapc[uVar14]) {
          return 0;
        }
        uVar14 = uVar14 + 1;
      } while (*plVar2 != -1);
    }
    lVar9 = GA[handle_00].num_rstrctd;
    if (lVar9 == GA[handle].num_rstrctd) {
      if (lVar9 < 1) {
        return 1;
      }
      lVar12 = 0;
      do {
        if (lVar9 == lVar12) {
          return 1;
        }
        plVar2 = GA[handle_00].rstrctd_list + lVar12;
        plVar4 = GA[handle].rstrctd_list + lVar12;
        lVar12 = lVar12 + 1;
      } while (*plVar2 == *plVar4);
      return 0;
    }
  }
  return 0;
}

Assistant:

logical pnga_compare_distr(Integer g_a, Integer g_b)
{
int h_a =(int)g_a + GA_OFFSET;
int h_b =(int)g_b + GA_OFFSET;
int h_a_maplen = calc_maplen(h_a);
int h_b_maplen = calc_maplen(h_b);
int i;

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   ga_check_handleM(g_a, "distribution a");
   ga_check_handleM(g_b, "distribution b");
   

   if(GA[h_a].ndim != GA[h_b].ndim) return FALSE; 

   for(i=0; i <GA[h_a].ndim; i++)
       if(GA[h_a].dims[i] != GA[h_b].dims[i]) return FALSE;

   if (GA[h_a].distr_type != GA[h_b].distr_type) return FALSE;
   if (GA[h_a].distr_type == REGULAR) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
   } else if (GA[h_a].distr_type == BLOCK_CYCLIC ||
       GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].block_dims[i] != GA[h_b].block_dims[i]) return FALSE;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].num_blocks[i] != GA[h_b].num_blocks[i]) return FALSE;
     }
     if (GA[h_a].distr_type == SCALAPACK || GA[h_a].distr_type == TILED) {
       for (i=0; i<GA[h_a].ndim; i++) {
         if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
       }
     }
   } else if (GA[h_a].distr_type == TILED_IRREG) {
     if (h_a_maplen != h_b_maplen) return FALSE;
     for(i=0; i <h_a_maplen; i++){
       if(GA[h_a].mapc[i] != GA[h_b].mapc[i]) return FALSE;
       if(GA[h_a].mapc[i] == -1) break;
     }
     for (i=0; i<GA[h_a].ndim; i++) {
       if (GA[h_a].nblock[i] != GA[h_b].nblock[i]) return FALSE;
     }
   }
   if (GA[h_a].num_rstrctd == GA[h_b].num_rstrctd) {
     if (GA[h_a].num_rstrctd > 0) {
       for (i=0; i<GA[h_a].num_rstrctd; i++) {
         if (GA[h_a].rstrctd_list[i] != GA[h_b].rstrctd_list[i]) return FALSE;
       }
     }
   } else {
     return FALSE;
   }
   return TRUE;
}